

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O1

XrResult ApiLayerInterface::GetApiLayerProperties
                   (string *openxr_command,uint32_t incoming_count,uint32_t *outgoing_count,
                   XrApiLayerProperties *api_layer_properties)

{
  XrResult XVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  manifest_files;
  string local_a8;
  undefined1 local_88 [32];
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_68;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_48;
  
  local_68.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (api_layer_properties != (XrApiLayerProperties *)0x0 && incoming_count != 0) {
    lVar2 = 0;
    do {
      if (*(int *)(api_layer_properties->layerName + lVar2 + -0x10) != 1) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,
                   "VUID-XrApiLayerProperties-type-type: unknown type in api_layer_properties","");
        local_88._0_8_ = (pointer)0x0;
        local_88._8_8_ = (pointer)0x0;
        local_88._16_8_ = (pointer)0x0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,&local_a8,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_88);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_88);
        goto LAB_0010602b;
      }
      lVar2 = lVar2 + 0x220;
    } while ((ulong)incoming_count * 0x220 - lVar2 != 0);
  }
  XVar1 = XR_ERROR_VALIDATION_FAILURE;
  if (outgoing_count != (uint32_t *)0x0) {
    XVar1 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_68);
    if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
      XVar1 = ApiLayerManifestFile::FindManifestFiles
                        (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&local_68);
    }
    if (XVar1 < XR_SUCCESS) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,
                 "ApiLayerInterface::GetApiLayerProperties - failed searching for API layer manifest files"
                 ,"");
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_88._16_8_ = (pointer)0x0;
      LoaderLogger::LogErrorMessage
                (openxr_command,&local_a8,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_88);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      uVar4 = (long)local_68.
                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar4 < 0xffffffff) {
        uVar3 = (uint)uVar4;
        *outgoing_count = uVar3;
        XVar1 = XR_SUCCESS;
        if (incoming_count != 0) {
          if (api_layer_properties == (XrApiLayerProperties *)0x0) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"xrEnumerateInstanceExtensionProperties","");
            local_88._0_8_ = (pointer)(local_88 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,
                       "VUID-xrEnumerateApiLayerProperties-properties-parameter: non-zero capacity but null array"
                       ,"");
            local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            LoaderLogger::LogErrorMessage(&local_a8,(string *)local_88,&local_48);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_48)
            ;
            if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
              operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
            }
LAB_0010602b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            XVar1 = XR_ERROR_VALIDATION_FAILURE;
          }
          else if (incoming_count < uVar3) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"xrEnumerateInstanceExtensionProperties","");
            local_88._0_8_ = (pointer)(local_88 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,
                       "VUID-xrEnumerateApiLayerProperties-propertyCapacityInput-parameter: insufficient space in array"
                       ,"");
            local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            LoaderLogger::LogErrorMessage(&local_a8,(string *)local_88,&local_48);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_48)
            ;
            if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
              operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            XVar1 = XR_ERROR_SIZE_INSUFFICIENT;
          }
          else if (local_68.
                   super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_68.
                   super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
            uVar4 = 0;
            XVar1 = XR_SUCCESS;
            do {
              ApiLayerManifestFile::PopulateApiLayerProperties
                        ((ApiLayerManifestFile *)
                         local_68.
                         super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                         ,api_layer_properties);
              uVar4 = uVar4 + 1;
              api_layer_properties = api_layer_properties + 1;
            } while (uVar3 + (uVar3 == 0) != uVar4);
          }
        }
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,
                   "ApiLayerInterface::GetApiLayerProperties - too many API layers found","");
        local_88._0_8_ = (pointer)0x0;
        local_88._8_8_ = (pointer)0x0;
        local_88._16_8_ = (pointer)0x0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,&local_a8,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_88);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        XVar1 = XR_ERROR_RUNTIME_FAILURE;
      }
    }
  }
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_68);
  return XVar1;
}

Assistant:

XrResult ApiLayerInterface::GetApiLayerProperties(const std::string& openxr_command, uint32_t incoming_count,
                                                  uint32_t* outgoing_count, XrApiLayerProperties* api_layer_properties) {
    std::vector<std::unique_ptr<ApiLayerManifestFile>> manifest_files;
    uint32_t manifest_count = 0;
    // Validate props struct before proceeding
    if (0 < incoming_count && nullptr != api_layer_properties) {
        for (uint32_t i = 0; i < incoming_count; i++) {
            if (XR_TYPE_API_LAYER_PROPERTIES != api_layer_properties[i].type) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "VUID-XrApiLayerProperties-type-type: unknown type in api_layer_properties");
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }

    // "Independent of elementCapacityInput or elements parameters, elementCountOutput must be a valid pointer,
    // and the function sets elementCountOutput." - 2.11
    if (nullptr == outgoing_count) {
        return XR_ERROR_VALIDATION_FAILURE;
    }

    // Find any implicit layers which we may need to report information for.
    XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
    if (XR_SUCCEEDED(result)) {
        // Find any explicit layers which we may need to report information for.
        result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, manifest_files);
    }
    if (XR_FAILED(result)) {
        LoaderLogger::LogErrorMessage(openxr_command,
                                      "ApiLayerInterface::GetApiLayerProperties - failed searching for API layer manifest files");
        return result;
    }

    // check for potential overflow before static_cast<uint32_t>
    if (manifest_files.size() >= UINT32_MAX) {
        LoaderLogger::LogErrorMessage(openxr_command, "ApiLayerInterface::GetApiLayerProperties - too many API layers found");
        return XR_ERROR_RUNTIME_FAILURE;
    }

    manifest_count = static_cast<uint32_t>(manifest_files.size());
    if (nullptr == outgoing_count) {
        LoaderLogger::LogErrorMessage("xrEnumerateInstanceExtensionProperties",
                                      "VUID-xrEnumerateApiLayerProperties-propertyCountOutput-parameter: null propertyCountOutput");
        return XR_ERROR_VALIDATION_FAILURE;
    }

    *outgoing_count = manifest_count;
    if (0 == incoming_count) {
        // capacity check only
        return XR_SUCCESS;
    }
    if (nullptr == api_layer_properties) {
        // incoming_count is not 0 BUT the api_layer_properties is NULL
        LoaderLogger::LogErrorMessage("xrEnumerateInstanceExtensionProperties",
                                      "VUID-xrEnumerateApiLayerProperties-properties-parameter: non-zero capacity but null array");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (incoming_count < manifest_count) {
        LoaderLogger::LogErrorMessage(
            "xrEnumerateInstanceExtensionProperties",
            "VUID-xrEnumerateApiLayerProperties-propertyCapacityInput-parameter: insufficient space in array");
        return XR_ERROR_SIZE_INSUFFICIENT;
    }

    for (uint32_t prop = 0; prop < incoming_count && prop < manifest_count; ++prop) {
        manifest_files[prop]->PopulateApiLayerProperties(api_layer_properties[prop]);
    }
    return XR_SUCCESS;
}